

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc-attack-detector.c
# Opt level: O0

_Bool detect_attack(crcda_ctx *ctx,uchar *buf,uint32_t len,uchar *IV)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint16_t *puVar4;
  long *local_50;
  uint8_t *d;
  uint8_t *c;
  uint32_t l;
  uint32_t j;
  uint32_t i;
  uchar *IV_local;
  uint32_t len_local;
  uchar *buf_local;
  crcda_ctx *ctx_local;
  
  if ((0x40000 < len) || ((len & 7) != 0)) {
    __assert_fail("!(len > (SSH_MAXBLOCKS * SSH_BLOCKSIZE) || len % SSH_BLOCKSIZE != 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/crc-attack-detector.c"
                  ,0x70,
                  "_Bool detect_attack(struct crcda_ctx *, const unsigned char *, uint32_t, const unsigned char *)"
                 );
  }
  for (c._4_4_ = ctx->n; c._4_4_ < (len >> 3) * 3 >> 1; c._4_4_ = c._4_4_ << 2) {
  }
  if (ctx->h == (uint16_t *)0x0) {
    ctx->n = c._4_4_;
    puVar4 = (uint16_t *)safemalloc((ulong)ctx->n,2,0);
    ctx->h = puVar4;
  }
  else if (ctx->n < c._4_4_) {
    ctx->n = c._4_4_;
    puVar4 = (uint16_t *)saferealloc(ctx->h,(ulong)ctx->n,2);
    ctx->h = puVar4;
  }
  d = buf;
  if (len < 0x39) {
    for (; d < buf + len; d = d + 8) {
      local_50 = (long *)buf;
      if ((IV != (uchar *)0x0) && (*(long *)d == *(long *)IV)) {
        _Var1 = check_crc(d,buf,len,IV);
        if (!_Var1) {
          return false;
        }
        return true;
      }
      for (; local_50 < d; local_50 = local_50 + 1) {
        if (*(long *)d == *local_50) {
          _Var1 = check_crc(d,buf,len,IV);
          if (_Var1) {
            return true;
          }
          break;
        }
      }
    }
  }
  else {
    memset(ctx->h,0xff,(ulong)ctx->n << 1);
    if (IV != (uchar *)0x0) {
      puVar4 = ctx->h;
      uVar3 = GET_32BIT_MSB_FIRST(IV);
      puVar4[uVar3 & ctx->n - 1] = 0xfffe;
    }
    uVar2 = 0;
    for (; d < buf + len; d = d + 8) {
      uVar3 = GET_32BIT_MSB_FIRST(d);
      for (l = uVar3 & ctx->n - 1; ctx->h[l] != 0xffff; l = l + 1 & ctx->n - 1) {
        if (ctx->h[l] == 0xfffe) {
          if (IV == (uchar *)0x0) {
            __assert_fail("IV",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/crc-attack-detector.c"
                          ,0x9a,
                          "_Bool detect_attack(struct crcda_ctx *, const unsigned char *, uint32_t, const unsigned char *)"
                         );
          }
          if (*(long *)d == *(long *)IV) {
            _Var1 = check_crc(d,buf,len,IV);
            if (_Var1) {
              return true;
            }
            break;
          }
        }
        else if (*(long *)d == *(long *)(buf + (int)((uint)ctx->h[l] << 3))) {
          _Var1 = check_crc(d,buf,len,IV);
          if (_Var1) {
            return true;
          }
          break;
        }
      }
      ctx->h[l] = uVar2;
      uVar2 = uVar2 + 1;
    }
  }
  return false;
}

Assistant:

bool detect_attack(struct crcda_ctx *ctx,
                   const unsigned char *buf, uint32_t len,
                   const unsigned char *IV)
{
    register uint32_t i, j;
    uint32_t l;
    register const uint8_t *c;
    const uint8_t *d;

    assert(!(len > (SSH_MAXBLOCKS * SSH_BLOCKSIZE) ||
             len % SSH_BLOCKSIZE != 0));
    for (l = ctx->n; l < HASH_FACTOR(len / SSH_BLOCKSIZE); l = l << 2)
        ;

    if (ctx->h == NULL) {
        ctx->n = l;
        ctx->h = snewn(ctx->n, uint16_t);
    } else {
        if (l > ctx->n) {
            ctx->n = l;
            ctx->h = sresize(ctx->h, ctx->n, uint16_t);
        }
    }

    if (len <= HASH_MINBLOCKS) {
        for (c = buf; c < buf + len; c += SSH_BLOCKSIZE) {
            if (IV && (!CMP(c, IV))) {
                if ((check_crc(c, buf, len, IV)))
                    return true;          /* attack detected */
                else
                    break;
            }
            for (d = buf; d < c; d += SSH_BLOCKSIZE) {
                if (!CMP(c, d)) {
                    if ((check_crc(c, buf, len, IV)))
                        return true;      /* attack detected */
                    else
                        break;
                }
            }
        }
        return false;                  /* ok */
    }
    memset(ctx->h, HASH_UNUSEDCHAR, ctx->n * HASH_ENTRYSIZE);

    if (IV)
        ctx->h[HASH(IV) & (ctx->n - 1)] = HASH_IV;

    for (c = buf, j = 0; c < (buf + len); c += SSH_BLOCKSIZE, j++) {
        for (i = HASH(c) & (ctx->n - 1); ctx->h[i] != HASH_UNUSED;
             i = (i + 1) & (ctx->n - 1)) {
            if (ctx->h[i] == HASH_IV) {
                assert(IV); /* or we wouldn't have stored HASH_IV above */
                if (!CMP(c, IV)) {
                    if (check_crc(c, buf, len, IV))
                        return true;      /* attack detected */
                    else
                        break;
                }
            } else if (!CMP(c, buf + ctx->h[i] * SSH_BLOCKSIZE)) {
                if (check_crc(c, buf, len, IV))
                    return true;          /* attack detected */
                else
                    break;
            }
        }
        ctx->h[i] = j;
    }
    return false;                          /* ok */
}